

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_check_collision_spheres(rf_vec3 center_a,float radius_a,rf_vec3 center_b,float radius_b)

{
  float fVar1;
  rf_vec3 v1;
  rf_vec3 v2;
  _Bool collision;
  float radius_b_local;
  float radius_a_local;
  rf_vec3 center_b_local;
  rf_vec3 center_a_local;
  
  v1 = rf_vec3_sub(center_b,center_a);
  v2 = rf_vec3_sub(center_b,center_a);
  fVar1 = rf_vec3_dot_product(v1,v2);
  return fVar1 <= (radius_a + radius_b) * (radius_a + radius_b);
}

Assistant:

RF_API bool rf_check_collision_spheres(rf_vec3 center_a, float radius_a, rf_vec3 center_b, float radius_b)
{
    bool collision = false;

// Simple way to check for collision, just checking distance between two points
// Unfortunately, sqrtf() is a costly operation, so we avoid it with following solution
/*
float dx = centerA.x - centerB.x;      // X distance between centers
float dy = centerA.y - centerB.y;      // Y distance between centers
float dz = centerA.z - centerB.z;      // Z distance between centers

float distance = sqrtf(dx*dx + dy*dy + dz*dz);  // Distance between centers

if (distance <= (radiusA + radiusB)) collision = true;
*/
// Check for distances squared to avoid sqrtf()
    if (rf_vec3_dot_product(rf_vec3_sub(center_b, center_a), rf_vec3_sub(center_b, center_a)) <=
        (radius_a + radius_b) * (radius_a + radius_b))
        collision = true;

    return collision;
}